

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.hpp
# Opt level: O2

ostream * cpp_bindgen::_impl::write_fortran_binding<void(bindgen_handle*,int)>
                    (ostream *strm,char *c_name,char *fortran_name)

{
  int iVar1;
  ostream *poVar2;
  ostream *poVar3;
  char *pcVar4;
  stringstream tmp_strm;
  allocator<char> local_219;
  string local_218;
  string local_1f8;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  fortran_function_specifier<void,_0>();
  poVar3 = local_1a8;
  poVar2 = std::operator<<(poVar3,(string *)&local_218);
  poVar2 = std::operator<<(poVar2," ");
  poVar2 = std::operator<<(poVar2,fortran_name);
  std::operator<<(poVar2,"(");
  std::__cxx11::string::~string((string *)&local_218);
  local_218._M_dataplus._M_p = (pointer)local_1b8;
  for_each_param<void(bindgen_handle*,int),cpp_bindgen::_impl::ignore_type_f,cpp_bindgen::_impl::write_fortran_binding<void(bindgen_handle*,int)>(std::ostream&,char_const*,char_const*)::_lambda(std::__cxx11::string_const&,int)_1_,std::tuple<bindgen_handle*,int>>
            ((ignore_type_f *)&local_1f8,(anon_class_8_1_448b3c02_for_m_fun *)&local_218);
  std::operator<<(poVar3,")");
  iVar1 = strcmp(c_name,fortran_name);
  if (iVar1 == 0) {
    pcVar4 = " bind(c)";
  }
  else {
    poVar3 = std::operator<<(poVar3," bind(c, name=\"");
    poVar3 = std::operator<<(poVar3,c_name);
    pcVar4 = "\")";
  }
  std::operator<<(poVar3,pcVar4);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d8,"    ",&local_219);
  wrap_line(&local_218,&local_1f8,&local_1d8);
  std::operator<<(strm,(string *)&local_218);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::operator<<(strm,"      use iso_c_binding\n");
  local_218._M_dataplus._M_p = (pointer)strm;
  for_each_param<void(bindgen_handle*,int),cpp_bindgen::_impl::fortran_param_type_from_c_f,cpp_bindgen::_impl::write_fortran_binding<void(bindgen_handle*,int)>(std::ostream&,char_const*,char_const*)::_lambda(std::__cxx11::string_const&,int)_2_,std::tuple<bindgen_handle*,int>>
            ((fortran_param_type_from_c_f *)&local_1f8,
             (anon_class_8_1_8991b55a_for_m_fun *)&local_218);
  poVar3 = std::operator<<(strm,"    end ");
  fortran_function_specifier<void,_0>();
  std::operator+(&local_218,&local_1f8,"\n");
  poVar3 = std::operator<<(poVar3,(string *)&local_218);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return poVar3;
}

Assistant:

std::ostream &write_fortran_binding(std::ostream &strm, char const *c_name, char const *fortran_name) {
            std::stringstream tmp_strm;
            tmp_strm << fortran_return_type<typename function_traits::result_type<CSignature>::type>() << " "
                     << fortran_name << "(";
            for_each_param<CSignature>(ignore_type_f{}, [&](const std::string &, int i) {
                if (i)
                    tmp_strm << ", ";
                tmp_strm << "arg" << i;
            });
            tmp_strm << ")";
            if (strcmp(c_name, fortran_name) == 0)
                tmp_strm << " bind(c)";
            else
                tmp_strm << " bind(c, name=\"" << c_name << "\")";
            strm << wrap_line(tmp_strm.str(), "    ");
            strm << "      use iso_c_binding\n";
            if (has_array_descriptor<CSignature>::value)
                strm << "      use bindgen_array_descriptor\n";
            for_each_param<CSignature>(fortran_param_type_from_c_f{},
                [&](const std::string &type_name, int i) { strm << "      " << type_name << " :: arg" << i << "\n"; });
            return strm << "    end "
                        << fortran_function_specifier<typename function_traits::result_type<CSignature>::type>() + "\n";
        }